

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O0

EvaluationResult __thiscall
chatra::TemporaryObject::evaluateAsPackageInitCall(TemporaryObject *this)

{
  StringId name;
  ScopeType SVar1;
  size_type sVar2;
  pointer this_00;
  MethodTable *this_01;
  Method *refMethod_00;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_58;
  Method *local_38;
  Method *refMethod;
  MethodTable *table;
  value_type *f;
  size_t frameIndex;
  TemporaryObject *this_local;
  
  frameIndex = (size_t)this;
  sVar2 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::size(&this->thread->frames);
  f = (value_type *)(sVar2 - 1);
  while( true ) {
    if (f == (value_type *)0xffffffffffffffff) {
      return Failed;
    }
    table = (MethodTable *)
            std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::operator[]
                      (&this->thread->frames,(size_type)f);
    SVar1 = Scope::getScopeType(((reference)table)->scope);
    if (SVar1 == Package) break;
    f = (value_type *)table->sourcePackagePtr;
  }
  this_00 = std::unique_ptr<chatra::Class,_std::default_delete<chatra::Class>_>::operator->
                      ((unique_ptr<chatra::Class,_std::default_delete<chatra::Class>_> *)
                       &(table->sourceClassPtr->methods).syncMap._M_h._M_rehash_policy.
                        _M_next_resize);
  this_01 = Class::refConstructors(this_00);
  name = this->name;
  local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  refMethod = (Method *)this_01;
  std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::vector(&local_58);
  refMethod_00 = MethodTable::find(this_01,(Class *)0x0,name,Invalid,&this->args,&local_58);
  std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::~vector(&local_58);
  if (((refMethod_00 != (Method *)0x0) && (refMethod_00->position == 0xffffffffffffffff)) &&
     ((refMethod_00->super_MethodBase).node != (Node *)0x0)) {
    local_38 = refMethod_00;
    setFrameMethod(this,0xffffffffffffffff,(Package *)table->sourceClassPtr,(MethodTable *)refMethod
                   ,refMethod_00,(Method *)0x0,(bool)(this->hasArgs & 1));
    resolveNativeMethod(this,this->name,Invalid);
    return Succeeded;
  }
  return Failed;
}

Assistant:

TemporaryObject::EvaluationResult TemporaryObject::evaluateAsPackageInitCall() {
	chatra_assert(requiresEvaluate());
	chatra_assert(!hasRef());
	chatra_assert(type == Type::Empty && hasName && name == StringId::Init && !hasArgs);

	size_t frameIndex = thread.frames.size() - 1;
	while (frameIndex != SIZE_MAX) {
		auto& f = thread.frames[frameIndex];
		if (f.scope->getScopeType() != ScopeType::Package) {
			frameIndex = f.parentIndex;
			continue;
		}

		auto& table = f.package.clPackage->refConstructors();
		auto* refMethod = table.find(nullptr, name, StringId::Invalid, args, {});
		if (refMethod == nullptr || refMethod->position != SIZE_MAX || refMethod->node == nullptr)
			return EvaluationResult::Failed;

		setFrameMethod(SIZE_MAX, &f.package, &table, refMethod, nullptr, hasArgs);
		resolveNativeMethod(name, StringId::Invalid);
		return EvaluationResult::Succeeded;
	}

	return EvaluationResult::Failed;
}